

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O1

ostream * notch::io::operator<<(ostream *out,valarray<double> *xs)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  
  pdVar1 = *(double **)(xs + 8);
  bVar4 = *(long *)xs == 0;
  pdVar3 = pdVar1;
  if (bVar4) {
    pdVar3 = (double *)0x0;
  }
  pdVar2 = pdVar1 + *(long *)xs;
  if (bVar4) {
    pdVar2 = (double *)0x0;
  }
  if (pdVar3 != pdVar2) {
    do {
      if (bVar4) {
        pdVar1 = (double *)0x0;
      }
      if (pdVar3 != pdVar1) {
        std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      }
      std::ostream::_M_insert<double>(*pdVar3);
      pdVar3 = pdVar3 + 1;
      pdVar1 = *(double **)(xs + 8);
      bVar4 = *(long *)xs == 0;
    } while ((bVar4) || (pdVar3 != pdVar1 + *(long *)xs));
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::valarray<double> &xs) {
    for (auto it = std::begin(xs); it != std::end(xs); ++it) {
        if (it != std::begin(xs)) {
            out << " ";
        }
        out << *it;
    }
    return out;
}